

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Accuracy::Texture2DMipmapCase::iterate(Texture2DMipmapCase *this)

{
  CoordType CVar1;
  code *pcVar2;
  RenderContext *context;
  TestContext *this_00;
  int iVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  TestLog *log_00;
  Texture2D *pTVar10;
  undefined4 extraout_var_00;
  char *pcVar11;
  NotSupportedError *this_01;
  TextureFormat *pTVar12;
  reference pvVar13;
  undefined4 extraout_var_01;
  PixelFormat *colorFmt;
  Texture2DView TVar14;
  int local_2dc;
  int local_2d8;
  string local_290;
  int local_26c;
  int local_268;
  int score;
  int worstScoreDiff;
  int bestScoreDiff;
  Texture2DView local_238;
  undefined1 local_228 [8];
  SurfaceAccess idealDst;
  int cellNdx;
  int curH;
  int curW;
  int curY;
  int curX;
  int gridX;
  int gridY;
  Sampler local_1dc;
  int local_1a0;
  int local_19c;
  int cellHeight;
  int cellWidth;
  int gridHeight;
  int gridWidth;
  Surface idealFrame;
  undefined1 local_168 [8];
  Surface renderedFrame;
  undefined1 local_148 [6];
  bool useLodBias;
  bool isProjected;
  vector<float,_std::allocator<float>_> texCoord;
  ReferenceParams sampleParams;
  RandomViewport viewport;
  int defViewportHeight;
  int defViewportWidth;
  int texHeight;
  int texWidth;
  TextureFormatInfo fmtInfo;
  TextureFormat *texFmt;
  Texture2D *refTexture;
  TestLog *log;
  Functions *gl;
  deUint32 magFilter;
  Texture2DMipmapCase *this_local;
  long lVar9;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  pTVar10 = glu::Texture2D::getRefTexture(this->m_texture);
  fmtInfo.lookupBias.m_data._8_8_ =
       tcu::TextureLevelPyramid::getFormat(&pTVar10->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&texHeight,(TextureFormat *)fmtInfo.lookupBias.m_data._8_8_);
  iVar3 = tcu::Texture2D::getWidth(pTVar10);
  iVar4 = tcu::Texture2D::getHeight(pTVar10);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pcVar11 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar11);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&sampleParams.baseLevel,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar5),iVar3 << 2,iVar4 << 2,dVar6);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)
             ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),TEXTURETYPE_2D);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_148);
  renderedFrame.m_pixels.m_cap._7_1_ = this->m_coordType == COORDTYPE_PROJECTED;
  renderedFrame.m_pixels.m_cap._6_1_ = this->m_coordType == COORDTYPE_BASIC_BIAS;
  tcu::Surface::Surface((Surface *)local_168,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)&gridHeight,viewport.x,viewport.y);
  cellWidth = 4;
  cellHeight = 4;
  local_19c = viewport.x / 4;
  local_1a0 = viewport.y / 4;
  if ((viewport.x < iVar3 << 2) || (viewport.y < iVar4 << 2)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureMipmapTests.cpp"
               ,0x11a);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  glu::mapGLSampler(&local_1dc,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  tcu::Sampler::operator=
            ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_1dc);
  pTVar10 = glu::Texture2D::getRefTexture(this->m_texture);
  pTVar12 = tcu::TextureLevelPyramid::getFormat(&pTVar10->super_TextureLevelPyramid);
  glu::TextureTestUtil::getSamplerType(*pTVar12);
  sampleParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  sampleParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  sampleParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  sampleParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  sampleParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
  sampleParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
  sampleParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  sampleParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  sampleParams.super_RenderParams.texType =
       (renderedFrame.m_pixels.m_cap._7_1_ & 1) + (renderedFrame.m_pixels.m_cap._6_1_ & 1) * 2;
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar9 + 8))(0x84c0);
  pcVar2 = *(code **)(lVar9 + 0xb8);
  dVar6 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar2)(0xde1,dVar6);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2800,0x2600);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureMipmapTests.cpp"
                  ,0x130);
  if ((iterate()::s_projections == '\0') &&
     (iVar5 = __cxa_guard_acquire(&iterate()::s_projections), iVar5 != 0)) {
    tcu::Vector<float,_4>::Vector(iterate::s_projections,1.2,1.0,0.7,1.0);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 1,1.3,0.8,0.6,2.0);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 2,0.8,1.0,1.7,0.6);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 3,1.2,1.0,1.7,1.5);
    __cxa_guard_release(&iterate()::s_projections);
  }
  curX = 0;
  do {
    if (cellHeight <= curX) {
      context = this->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)&worstScoreDiff,(Surface *)local_168);
      glu::readPixels(context,sampleParams.baseLevel,sampleParams.maxLevel,
                      (PixelBufferAccess *)&worstScoreDiff);
      iVar5 = iVar3;
      if (iVar3 < 0) {
        iVar5 = iVar3 + 0xf;
      }
      iVar7 = iVar4;
      if (iVar4 < 0) {
        iVar7 = iVar4 + 0xf;
      }
      score = (iVar5 >> 4) * (iVar7 >> 4);
      local_268 = iVar3 * iVar4;
      local_26c = glu::TextureTestUtil::measureAccuracy
                            (log_00,(Surface *)&gridHeight,(Surface *)local_168,score,local_268);
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      de::toString<int>(&local_290,&local_26c);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar11);
      std::__cxx11::string::~string((string *)&local_290);
      tcu::Surface::~Surface((Surface *)&gridHeight);
      tcu::Surface::~Surface((Surface *)local_168);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_148);
      return STOP;
    }
    for (curY = 0; curY < cellWidth; curY = curY + 1) {
      iVar5 = local_19c * curY;
      iVar7 = local_1a0 * curX;
      if (curY + 1 == cellWidth) {
        local_2d8 = viewport.x - iVar5;
      }
      else {
        local_2d8 = local_19c;
      }
      if (curX + 1 == cellHeight) {
        local_2dc = viewport.y - iVar7;
      }
      else {
        local_2dc = local_1a0;
      }
      idealDst._28_4_ = curX * cellWidth + curY;
      CVar1 = this->m_coordType;
      if (CVar1 < COORDTYPE_AFFINE) {
LAB_00492f6f:
        getBasicTexCoord2D((vector<float,_std::allocator<float>_> *)local_148,idealDst._28_4_);
      }
      else if (CVar1 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D((vector<float,_std::allocator<float>_> *)local_148,idealDst._28_4_);
      }
      else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_00492f6f;
      if ((renderedFrame.m_pixels.m_cap._7_1_ & 1) != 0) {
        sampleParams.super_RenderParams.samplerType =
             (SamplerType)iterate::s_projections[(int)idealDst._28_4_ % 4].m_data[0];
        sampleParams.super_RenderParams.flags =
             (deUint32)iterate::s_projections[(int)idealDst._28_4_ % 4].m_data[1];
        sampleParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)(iterate::s_projections[(int)idealDst._28_4_ % 4].m_data + 2);
      }
      if ((renderedFrame.m_pixels.m_cap._6_1_ & 1) != 0) {
        sampleParams.super_RenderParams.w.m_data[2] = iterate::s_bias[(int)idealDst._28_4_ % 8];
      }
      (**(code **)(lVar9 + 0x1a00))
                (sampleParams.baseLevel + iVar5,sampleParams.maxLevel + iVar7,local_2d8,local_2dc);
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_148,0);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,pvVar13,
                 (RenderParams *)
                 ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
      iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      colorFmt = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar8));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_228,(Surface *)&gridHeight,colorFmt,iVar5,iVar7,local_2d8,
                 local_2dc);
      sampleParams.sampler.seamlessCubeMap = false;
      sampleParams.sampler._53_3_ = 0;
      pTVar10 = glu::Texture2D::getRefTexture(this->m_texture);
      TVar14 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar10);
      local_238.m_levels = TVar14.m_levels;
      local_238.m_numLevels = TVar14.m_numLevels;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_148,0);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_228,&local_238,pvVar13,
                 (ReferenceParams *)
                 ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
    }
    curX = curX + 1;
  } while( true );
}

Assistant:

Texture2DMipmapCase::IterateResult Texture2DMipmapCase::iterate (void)
{
	// Constants.
	const deUint32				magFilter			= GL_NEAREST;

	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&	texFmt				= refTexture.getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);

	int							texWidth			= refTexture.getWidth();
	int							texHeight			= refTexture.getHeight();
	int							defViewportWidth	= texWidth*4;
	int							defViewportHeight	= texHeight*4;

	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	ReferenceParams				sampleParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;
	bool						isProjected			= m_coordType == COORDTYPE_PROJECTED;
	bool						useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Accuracy cases test against ideal lod computation.
	tcu::Surface				idealFrame			(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	int							gridWidth			= 4;
	int							gridHeight			= 4;
	int							cellWidth			= viewport.width / gridWidth;
	int							cellHeight			= viewport.height / gridHeight;

	// Accuracy measurements are off unless we get the expected viewport size.
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampleParams.samplerType	= glu::TextureTestUtil::getSamplerType(m_texture->getRefTexture().getFormat());
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);

	// Upload texture data.
	m_texture->upload();

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int				curX		= cellWidth*gridX;
			int				curY		= cellHeight*gridY;
			int				curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int				curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int				cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);

			// Render reference(s).
			{
				tcu::SurfaceAccess idealDst(idealFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
				sampleParams.lodMode = LODMODE_EXACT;
				sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], sampleParams);
			}
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= (texWidth/16)*(texHeight/16);
		const int	worstScoreDiff	= texWidth*texHeight;

		int score = measureAccuracy(log, idealFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}